

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::write_element_end(t_xml_generator *this)

{
  ostream *poVar1;
  reference pvVar2;
  string local_30;
  t_xml_generator *local_10;
  t_xml_generator *this_local;
  
  local_10 = this;
  t_generator::indent_down(&this->super_t_generator);
  if (((this->top_element_is_empty & 1U) == 0) || ((this->top_element_is_open & 1U) == 0)) {
    t_generator::indent_abi_cxx11_(&local_30,&this->super_t_generator);
    poVar1 = std::operator<<((ostream *)&this->f_xml_,(string *)&local_30);
    poVar1 = std::operator<<(poVar1,"</");
    pvVar2 = std::
             stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::top(&this->elements_);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    poVar1 = std::operator<<(poVar1,">");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    poVar1 = std::operator<<((ostream *)&this->f_xml_," />");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  }
  this->top_element_is_empty = false;
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pop(&this->elements_);
  return;
}

Assistant:

void t_xml_generator::write_element_end() {
  indent_down();
  if (top_element_is_empty && top_element_is_open) {
    f_xml_ << " />" << endl;
  } else {
    f_xml_ << indent() << "</" << elements_.top() << ">" << endl;
  }
  top_element_is_empty = false;
  elements_.pop();
}